

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ef7149::LowBDConvolveScaleTest::SetUp(LowBDConvolveScaleTest *this)

{
  int iVar1;
  undefined4 uVar2;
  _Tuple_impl<0UL,_int,_int> _Var3;
  undefined4 uVar4;
  uint uVar5;
  ParamType *pPVar6;
  TestImage<unsigned_char> *pTVar7;
  SEARCH_METHODS *message;
  AssertHelper AStack_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertionResult gtest_ar;
  
  pPVar6 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
           ::GetParam();
  this->tst_fun_ =
       (LowbdConvolveFunc)
       (pPVar6->
       super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
       ).
       super__Head_base<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_false>
       ._M_head_impl;
  pPVar6 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>_>
           ::GetParam();
  _Var3 = (pPVar6->
          super__Tuple_impl<0UL,_void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*),_std::tuple<int,_int>_>
          ).super__Tuple_impl<1UL,_std::tuple<int,_int>_>.
          super__Head_base<1UL,_std::tuple<int,_int>,_false>._M_head_impl.
          super__Tuple_impl<0UL,_int,_int>;
  (this->super_ConvolveScaleTestBase<unsigned_char>).width_ =
       _Var3.super__Head_base<0UL,_int,_false>._M_head_impl._M_head_impl;
  (this->super_ConvolveScaleTestBase<unsigned_char>).height_ =
       (int)_Var3.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl.
            super__Head_base<1UL,_int,_false>;
  (this->super_ConvolveScaleTestBase<unsigned_char>).bd_ = 8;
  pTVar7 = (this->super_ConvolveScaleTestBase<unsigned_char>).image_;
  if (pTVar7 != (TestImage<unsigned_char> *)0x0) {
    TestImage<unsigned_char>::~TestImage(pTVar7);
  }
  operator_delete(pTVar7);
  pTVar7 = (TestImage<unsigned_char> *)operator_new(0x60);
  iVar1 = (this->super_ConvolveScaleTestBase<unsigned_char>).width_;
  pTVar7->w_ = iVar1;
  uVar2 = (this->super_ConvolveScaleTestBase<unsigned_char>).height_;
  uVar4 = (this->super_ConvolveScaleTestBase<unsigned_char>).bd_;
  pTVar7->h_ = uVar2;
  pTVar7->bd_ = uVar4;
  uVar5 = iVar1 + 0x4fU & 0xfffffff0;
  (pTVar7->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar7->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar7->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar7->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar7->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar7->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar7->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar7->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar7->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar7->src_stride_ = uVar5;
  pTVar7->dst_stride_ = uVar5 + 0x10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pTVar7->src_data_,(long)(int)((uVar2 + 0x40) * uVar5 * 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pTVar7->dst_data_,(long)((pTVar7->h_ + 0x40) * pTVar7->dst_stride_ * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar7->dst_16_data_,(long)((pTVar7->h_ + 0x40) * pTVar7->dst_stride_ * 2));
  (this->super_ConvolveScaleTestBase<unsigned_char>).image_ = pTVar7;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0xcf,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void SetUp() override {
    tst_fun_ = GET_PARAM(0);

    const BlockDimension &block = GET_PARAM(1);
    const int bd = 8;

    SetParams(BaseParams(block), bd);
  }